

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderMoreInputVerticesThanAvailableTest::iterate
          (GeometryShaderMoreInputVerticesThanAvailableTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  GLuint *pGVar5;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  long lVar6;
  GLuint i;
  char **sh2_body_parts;
  qpTestResult testResult;
  ulong uVar7;
  bool has_shader_compilation_failed;
  char *vs_code_specialized_raw;
  char *fs_code_specialized_raw;
  char *gs_code_triangles_adjacency;
  char *gs_code_triangles;
  char *gs_code_lines_adjacency;
  char *gs_code_lines;
  char *gs_code_points;
  char *gs_codes_specialized_raw [5];
  string vs_code_specialized;
  string fs_code_specialized;
  string gs_codes_specialized [5];
  undefined1 local_1b0 [384];
  
  gs_code_points =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (points)                   in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[1].gl_Position;\n    EmitVertex();\n}\n"
  ;
  gs_code_lines =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (lines)                    in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[2].gl_Position;\n    EmitVertex();\n}\n"
  ;
  gs_code_lines_adjacency =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (lines_adjacency)          in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[4].gl_Position;\n    EmitVertex();\n}\n"
  ;
  gs_code_triangles =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (triangles)                in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[3].gl_Position;\n    EmitVertex();\n}\n"
  ;
  gs_code_triangles_adjacency =
       "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (triangles_adjacency)      in;\nlayout (points, max_vertices = 1) out;\n\nvoid main()\n{\n    gl_Position = gl_in[6].gl_Position;\n    EmitVertex();\n}\n"
  ;
  has_shader_compilation_failed = true;
  uVar7 = (ulong)this->m_number_of_gs << 2;
  pGVar5 = (GLuint *)operator_new__(uVar7);
  this->m_gs_ids = pGVar5;
  pGVar5 = (GLuint *)operator_new__(uVar7);
  this->m_po_ids = pGVar5;
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0x899);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  uVar7 = 0;
  while( true ) {
    if (this->m_number_of_gs <= uVar7) break;
    GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
    this->m_gs_ids[uVar7] = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x8a2);
    GVar3 = (**(code **)(lVar6 + 0x3c8))();
    this->m_po_ids[uVar7] = GVar3;
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x8a5);
    uVar7 = uVar7 + 1;
  }
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glCreateShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x8ab);
  TestCaseBase::specializeShader_abi_cxx11_
            (&fs_code_specialized,&this->super_TestCaseBase,1,&dummy_fs_code);
  fs_code_specialized_raw = fs_code_specialized._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized,&this->super_TestCaseBase,1,&gs_code_points);
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized + 1,&this->super_TestCaseBase,1,&gs_code_lines);
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized + 2,&this->super_TestCaseBase,1,&gs_code_lines_adjacency);
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized + 3,&this->super_TestCaseBase,1,&gs_code_triangles);
  TestCaseBase::specializeShader_abi_cxx11_
            (gs_codes_specialized + 4,&this->super_TestCaseBase,1,&gs_code_triangles_adjacency);
  gs_codes_specialized_raw[0] = gs_codes_specialized[0]._M_dataplus._M_p;
  gs_codes_specialized_raw[1] = gs_codes_specialized[1]._M_dataplus._M_p;
  gs_codes_specialized_raw[2] = gs_codes_specialized[2]._M_dataplus._M_p;
  gs_codes_specialized_raw[3] = gs_codes_specialized[3]._M_dataplus._M_p;
  gs_codes_specialized_raw[4] = gs_codes_specialized[4]._M_dataplus._M_p;
  testResult = QP_TEST_RESULT_FAIL;
  TestCaseBase::specializeShader_abi_cxx11_
            (&vs_code_specialized,&this->super_TestCaseBase,1,&dummy_vs_code);
  vs_code_specialized_raw = vs_code_specialized._M_dataplus._M_p;
  sh2_body_parts = gs_codes_specialized_raw;
  uVar7 = 0;
  do {
    if (this->m_number_of_gs <= uVar7) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00cf267e;
    }
    bVar1 = TestCaseBase::buildProgram
                      (&this->super_TestCaseBase,this->m_po_ids[uVar7],this->m_fs_id,1,
                       &fs_code_specialized_raw,this->m_gs_ids[uVar7],1,sh2_body_parts,this->m_vs_id
                       ,1,&vs_code_specialized_raw,&has_shader_compilation_failed);
    uVar7 = uVar7 + 1;
    sh2_body_parts = sh2_body_parts + 1;
  } while (!bVar1);
  local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Program object linking successful for i = ");
  std::operator<<((ostream *)this_00,"[");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"], whereas a failure was expected.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  description = "Fail";
LAB_00cf267e:
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,testResult,
             description);
  std::__cxx11::string::~string((string *)&vs_code_specialized);
  lVar6 = 0x80;
  do {
    std::__cxx11::string::~string
              ((string *)((long)&gs_codes_specialized[0]._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  std::__cxx11::string::~string((string *)&fs_code_specialized);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderMoreInputVerticesThanAvailableTest::iterate()
{
	/* Define 5 Geometry Shaders for purpose of this test. */
	const char* gs_code_points = "${VERSION}\n"
								 "${GEOMETRY_SHADER_REQUIRE}\n"
								 "\n"
								 "layout (points)                   in;\n"
								 "layout (points, max_vertices = 1) out;\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "    gl_Position = gl_in[1].gl_Position;\n"
								 "    EmitVertex();\n"
								 "}\n";

	const char* gs_code_lines = "${VERSION}\n"
								"${GEOMETRY_SHADER_REQUIRE}\n"
								"\n"
								"layout (lines)                    in;\n"
								"layout (points, max_vertices = 1) out;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    gl_Position = gl_in[2].gl_Position;\n"
								"    EmitVertex();\n"
								"}\n";

	const char* gs_code_lines_adjacency = "${VERSION}\n"
										  "${GEOMETRY_SHADER_REQUIRE}\n"
										  "\n"
										  "layout (lines_adjacency)          in;\n"
										  "layout (points, max_vertices = 1) out;\n"
										  "\n"
										  "void main()\n"
										  "{\n"
										  "    gl_Position = gl_in[4].gl_Position;\n"
										  "    EmitVertex();\n"
										  "}\n";

	const char* gs_code_triangles = "${VERSION}\n"
									"${GEOMETRY_SHADER_REQUIRE}\n"
									"\n"
									"layout (triangles)                in;\n"
									"layout (points, max_vertices = 1) out;\n"
									"\n"
									"void main()\n"
									"{\n"
									"    gl_Position = gl_in[3].gl_Position;\n"
									"    EmitVertex();\n"
									"}\n";

	const char* gs_code_triangles_adjacency = "${VERSION}\n"
											  "${GEOMETRY_SHADER_REQUIRE}\n"
											  "\n"
											  "layout (triangles_adjacency)      in;\n"
											  "layout (points, max_vertices = 1) out;\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    gl_Position = gl_in[6].gl_Position;\n"
											  "    EmitVertex();\n"
											  "}\n";

	bool has_shader_compilation_failed = true;
	bool result						   = true;

	m_gs_ids = new glw::GLuint[m_number_of_gs];
	m_po_ids = new glw::GLuint[m_number_of_gs];

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create program objects & geometry shader objects. */
	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		m_gs_ids[i] = gl.createShader(GL_GEOMETRY_SHADER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		m_po_ids[i] = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");
	}

	/* Create shader object. */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call(s) failed.");

	/* Try to link the test program object */
	std::string fs_code_specialized		= specializeShader(1, &dummy_fs_code);
	const char* fs_code_specialized_raw = fs_code_specialized.c_str();

	std::string gs_codes_specialized[] = { specializeShader(1, &gs_code_points), specializeShader(1, &gs_code_lines),
										   specializeShader(1, &gs_code_lines_adjacency),
										   specializeShader(1, &gs_code_triangles),
										   specializeShader(1, &gs_code_triangles_adjacency) };

	const char* gs_codes_specialized_raw[] = { gs_codes_specialized[0].c_str(), gs_codes_specialized[1].c_str(),
											   gs_codes_specialized[2].c_str(), gs_codes_specialized[3].c_str(),
											   gs_codes_specialized[4].c_str() };

	std::string vs_code_specialized		= specializeShader(1, &dummy_vs_code);
	const char* vs_code_specialized_raw = vs_code_specialized.c_str();

	for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
	{
		if (TestCaseBase::buildProgram(m_po_ids[i], m_fs_id, 1,					 /* n_sh1_body_parts */
									   &fs_code_specialized_raw, m_gs_ids[i], 1, /* n_sh2_body_parts */
									   &gs_codes_specialized_raw[i], m_vs_id, 1, /* n_sh3_body_parts */
									   &vs_code_specialized_raw, &has_shader_compilation_failed))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Program object linking successful for i = "
							   << "[" << i << "], whereas a failure was expected." << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}